

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::FunctionCall::FunctionCall
          (FunctionCall *this,Context *c,Function *function,
          pool_ptr<soul::AST::CommaSeparatedList> *args,bool isMethod)

{
  pool_ptr<soul::AST::CommaSeparatedList> local_18;
  
  local_18 = (pool_ptr<soul::AST::CommaSeparatedList>)args->object;
  CallOrCastBase::CallOrCastBase(&this->super_CallOrCastBase,FunctionCall,c,&local_18,isMethod);
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__CallOrCastBase_002fa7b8;
  this->targetFunction = function;
  return;
}

Assistant:

FunctionCall (const Context& c, Function& function, pool_ptr<CommaSeparatedList> args, bool isMethod)
            : CallOrCastBase (ObjectType::FunctionCall, c, args, isMethod), targetFunction (function)
        {}